

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decomp.c
# Opt level: O3

void ddb_ex(long ndims,Integer *ardims,long npes,double threshold,Integer *blk,Integer *pedims)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  void *__ptr;
  long lVar4;
  void *__src;
  long *__ptr_00;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  
  if (ndims == 1) {
    *pedims = npes;
    lVar4 = 1;
    if (1 < *ardims / npes) {
      lVar4 = *ardims / npes;
    }
    *blk = lVar4;
  }
  else {
    __ptr = calloc(ndims,8);
    if (__ptr == (void *)0x0) {
      ddb_ex_cold_1();
    }
    else {
      if (0 < ndims) {
        lVar4 = 0;
        do {
          if (blk[lVar4] < 1) {
            blk[lVar4] = 1;
          }
          lVar4 = lVar4 + 1;
        } while (ndims != lVar4);
        if (0 < ndims) {
          lVar4 = 0;
          do {
            *(long *)((long)__ptr + lVar4 * 8) = ardims[lVar4] / blk[lVar4];
            lVar4 = lVar4 + 1;
          } while (ndims != lVar4);
          if (0 < ndims) {
            lVar4 = 0;
            do {
              if (*(long *)((long)__ptr + lVar4 * 8) < 1) {
                *(undefined8 *)((long)__ptr + lVar4 * 8) = 1;
                blk[lVar4] = ardims[lVar4];
              }
              lVar4 = lVar4 + 1;
            } while (ndims != lVar4);
          }
        }
      }
      __src = calloc(ndims,8);
      if (__src != (void *)0x0) {
        __ptr_00 = (long *)calloc(ndims,8);
        if (__ptr_00 == (long *)0x0) {
          fprintf(_stderr,"%s: %s\n","ddb_ex","memory allocation failed");
          if (0 < ndims) {
            memset(blk,0,ndims << 3);
          }
        }
        else {
          if (ndims < 1) {
            *pedims = npes;
            lVar4 = 1;
          }
          else {
            lVar4 = 1;
            lVar5 = 0;
            do {
              lVar4 = lVar4 * *(long *)((long)__ptr + lVar5 * 8);
              lVar5 = lVar5 + 1;
            } while (ndims != lVar5);
            *pedims = npes;
            auVar3 = _DAT_001b1a00;
            auVar2 = _DAT_001b19e0;
            lVar5 = ndims + -2;
            auVar13._8_4_ = (int)lVar5;
            auVar13._0_8_ = lVar5;
            auVar13._12_4_ = (int)((ulong)lVar5 >> 0x20);
            uVar6 = 0;
            auVar13 = auVar13 ^ _DAT_001b19e0;
            do {
              auVar15._8_4_ = (int)uVar6;
              auVar15._0_8_ = uVar6;
              auVar15._12_4_ = (int)(uVar6 >> 0x20);
              auVar15 = (auVar15 | auVar3) ^ auVar2;
              if ((bool)(~(auVar15._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar15._0_4_ ||
                          auVar13._4_4_ < auVar15._4_4_) & 1)) {
                pedims[uVar6 + 1] = 1;
              }
              if ((auVar15._12_4_ != auVar13._12_4_ || auVar15._8_4_ <= auVar13._8_4_) &&
                  auVar15._12_4_ <= auVar13._12_4_) {
                pedims[uVar6 + 2] = 1;
              }
              uVar6 = uVar6 + 2;
            } while ((ndims & 0x7ffffffffffffffeU) != uVar6);
          }
          *__ptr_00 = npes;
          lVar5 = 1;
          if (1 < ndims) {
            lVar5 = ndims;
          }
          dVar12 = -1.0;
          lVar8 = 0;
joined_r0x001957e4:
          do {
            while (lVar8 == ndims + -1) {
              *(long *)((long)__src + ndims * 8 + -8) = __ptr_00[ndims + -1];
              if (ndims < 1) {
                dVar14 = 1.0;
LAB_001958dd:
                lVar8 = 0;
              }
              else {
                lVar8 = 0;
                dVar14 = 1.0;
                do {
                  lVar7 = *(long *)((long)__ptr + lVar8 * 8);
                  dVar14 = dVar14 * ((double)(lVar7 - lVar7 % *(long *)((long)__src + lVar8 * 8)) /
                                    (double)lVar7);
                  lVar8 = lVar8 + 1;
                } while (ndims != lVar8);
                if (ndims < 1) goto LAB_001958dd;
                lVar8 = 0;
                lVar7 = 0;
                do {
                  lVar9 = 1;
                  lVar10 = 0;
                  do {
                    if (lVar7 != lVar10) {
                      lVar9 = lVar9 * (*(long *)((long)__ptr + lVar10 * 8) /
                                      *(long *)((long)__src + lVar10 * 8));
                    }
                    lVar10 = lVar10 + 1;
                  } while (ndims != lVar10);
                  lVar8 = lVar8 + lVar9;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != ndims);
              }
              if (dVar14 <= dVar12) {
                bVar1 = dVar14 == dVar12;
                bVar11 = lVar8 < lVar4;
                if (bVar11 && bVar1) {
                  dVar12 = dVar14;
                  lVar4 = lVar8;
                }
                if ((bVar11 && bVar1) && 0 < ndims) goto LAB_0019591b;
              }
              else {
                lVar4 = lVar8;
                dVar12 = dVar14;
                if (0 < ndims) {
LAB_0019591b:
                  memcpy(pedims,__src,lVar5 << 3);
                  lVar4 = lVar8;
                  dVar12 = dVar14;
                }
              }
              if (threshold < dVar12) goto LAB_0019596c;
              *(undefined8 *)((long)__src + ndims * 8 + -8) = 0;
              lVar8 = ndims + -2;
            }
            lVar7 = *(long *)((long)__src + lVar8 * 8);
            if (lVar7 != __ptr_00[lVar8]) {
              do {
                lVar7 = lVar7 + 1;
              } while (__ptr_00[lVar8] % lVar7 != 0);
              *(long *)((long)__src + lVar8 * 8) = lVar7;
              __ptr_00[lVar8 + 1] = npes;
              if (-1 < lVar8) {
                lVar9 = 0;
                lVar7 = npes;
                do {
                  lVar7 = lVar7 / *(long *)((long)__src + lVar9 * 8);
                  lVar9 = lVar9 + 1;
                } while (lVar8 + 1 != lVar9);
                __ptr_00[lVar8 + 1] = lVar7;
              }
              *(undefined8 *)((long)__src + lVar8 * 8 + 8) = 0;
              lVar8 = lVar8 + 1;
              goto joined_r0x001957e4;
            }
            *(undefined8 *)((long)__src + lVar8 * 8) = 0;
            bVar11 = lVar8 != 0;
            lVar8 = lVar8 + -1;
          } while (bVar11);
LAB_0019596c:
          if (0 < ndims) {
            lVar4 = 0;
            do {
              lVar5 = ardims[lVar4] / pedims[lVar4];
              if (lVar5 < 2) {
                lVar5 = 1;
              }
              blk[lVar4] = lVar5;
              lVar4 = lVar4 + 1;
            } while (ndims != lVar4);
          }
          free(__ptr);
          free(__ptr_00);
          __ptr = __src;
        }
        free(__ptr);
        return;
      }
      fwrite("ddb_ex: Memory allocation failed\n",0x21,1,_stderr);
      if (0 < ndims) {
        memset(blk,0,ndims << 3);
        return;
      }
    }
  }
  return;
}

Assistant:

void ddb_ex( long ndims, Integer ardims[], long npes, double threshold,
             Integer blk[], Integer pedims[])
{
      Integer *tdims;
      long *pdivs;
      long npdivs;
      long i, j, k;
      long bev;
      long pc, done;
      long *stack;
      Integer *tard;
      long r, cev;
      double clb, blb;

      /*- Quick exit -*/
      if(ndims==1) {
           pedims[0] = npes;
           blb = dd_ev(ndims,ardims,pedims);
           dd_su(1,ardims,pedims,blk);
           return;
      }

      /*- Reset array dimensions to reflect granularity -*/
      tard = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tard==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }
      for(i=0;i<ndims;i++) if (blk[i]<1) blk[i] = 1;
      for(i=0;i<ndims;i++) tard[i] = ardims[i] / blk[i];
      for(i=0;i<ndims;i++) if (tard[i]<1) {
         tard[i] = 1; blk[i] = ardims[i]; }

      /*- Allocate memory for current solution -*/
      tdims = (Integer *) calloc((size_t)ndims,sizeof(Integer));
      if(tdims==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         return;
      }

      /*- Allocate memory to hold divisors of npes -*/
      npdivs = 1;
      for(i=2;i<=npes;i++) if(npes%i==0) npdivs += 1;
      pdivs = (long *) calloc((size_t)npdivs,sizeof(long));
      if(pdivs==NULL) {
         fprintf(stderr,"ddb_ex: Memory allocation failed\n");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         return;
      }

      /*- Allocate storage for the recursion stack -*/
      stack = (long *) calloc((size_t)ndims,sizeof(long));
      if(stack==NULL){
         fprintf(stderr,"%s: %s\n","ddb_ex",
             "memory allocation failed");
         for(i=0;i<ndims;i++) blk[i] = 0;
         free(tard);
         free(pdivs);
         return;
      }

      /*- Find all divisors of npes -*/
      for(j=0,i=1;i<=npes;i++) if(npes%i==0) pdivs[j++] = i;

      /*- Pump priming the exhaustive search -*/
      blb = -1.0;
      bev = 1.0;
      for(i=0;i<ndims;i++) bev *= tard[i];
      pedims[0]=npes; for(i=1;i<ndims;i++) pedims[i] = 1;
      tdims[0] = 0;
      stack[0] = npes;
      pc = 0;
      done = 0;

      /*-  Recursion loop -*/
      do {
         if(pc==ndims-1) {
	   /*- Set the number of processes for the last dimension -*/
           tdims[pc] = stack[pc];

	   /*- Evaluate current solution  -*/
            clb = dd_ev(ndims,tard,tdims);
            cev = 0;
            for(k=0; k<ndims; k++){
               r = 1;
               for(j=0; j<ndims; j++) {
                  if(j!=k) r = r*(tard[j]/tdims[j]);
               }
               cev = cev+r;
            }
            if(clb>blb || (clb==blb && cev<bev)) {
               for(j=0; j<ndims; j++) pedims[j] = tdims[j];
               blb = clb;
               bev = cev;
            }
            if(blb>threshold) break;
            tdims[pc] = 0;
            pc -= 1;
         } else {
           if( tdims[pc] == stack[pc] ) {
	     /*- Backtrack when current array dimension has exhausted 
              *- all remaining processes
              */
              done = (pc==0);
              tdims[pc] = 0;
              pc -= 1;
           } else {
	     /*- Increment the number of processes assigned to the current
              *- array axis.
              */
              for(tdims[pc]+=1; stack[pc]%tdims[pc]!=0; tdims[pc]+=1);
              pc += 1;
              stack[pc] = npes;
              for(i=0;i<pc;i++) stack[pc] /= tdims[i];
              tdims[pc] = 0;
           }
         }
      } while(!done);

      dd_su(ndims,ardims,pedims,blk);

      free(tard);
      free(stack);
      free(tdims);
      free(pdivs);
}